

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::ComputeLinkInterfaceLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget,bool usage_requirements_only)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  TargetType TVar6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  string *psVar10;
  const_iterator __first;
  const_iterator __last;
  PolicyID id;
  PolicyID id_00;
  char *local_608;
  string local_550;
  string local_530;
  undefined1 local_510 [8];
  ostringstream w_1;
  undefined1 local_398 [8];
  string newLibraries;
  string oldLibraries;
  string local_350;
  bool local_329;
  char *pcStack_328;
  bool hadHeadSensitiveConditionDummy;
  char *newExplicitLibraries_1;
  undefined1 local_318 [8];
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_2e8;
  const_iterator local_2e0;
  LinkImplementationLibraries *local_2d8;
  LinkImplementationLibraries *impl;
  string local_2c8;
  undefined4 local_2a4;
  string local_2a0;
  string local_280;
  undefined1 local_260 [8];
  ostringstream w;
  allocator local_e1;
  string local_e0;
  char *local_c0;
  char *newExplicitLibraries;
  string linkIfaceProp;
  char *explicitLibraries;
  allocator local_59;
  string local_58 [8];
  string suffix;
  bool usage_requirements_only_local;
  cmTarget *headTarget_local;
  OptionalLinkInterface *iface_local;
  string *config_local;
  cmTarget *thisTarget_local;
  cmTargetInternals *this_local;
  
  suffix.field_2._M_local_buf[0xf] = usage_requirements_only;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"_",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)&explicitLibraries,config);
    std::__cxx11::string::operator+=(local_58,(string *)&explicitLibraries);
    std::__cxx11::string::~string((string *)&explicitLibraries);
  }
  else {
    std::__cxx11::string::operator+=(local_58,"NOCONFIG");
  }
  linkIfaceProp.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&newExplicitLibraries);
  PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
  if ((PVar4 == OLD) || (PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar4 == WARN)) {
    TVar6 = cmTarget::GetType(thisTarget);
    if ((TVar6 == SHARED_LIBRARY) || (bVar3 = cmTarget::IsExecutableWithExports(thisTarget), bVar3))
    {
      std::__cxx11::string::operator=((string *)&newExplicitLibraries,"LINK_INTERFACE_LIBRARIES");
      std::__cxx11::string::operator+=((string *)&newExplicitLibraries,local_58);
      linkIfaceProp.field_2._8_8_ =
           cmTarget::GetProperty(thisTarget,(string *)&newExplicitLibraries);
      if ((char *)linkIfaceProp.field_2._8_8_ == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&newExplicitLibraries,"LINK_INTERFACE_LIBRARIES");
        linkIfaceProp.field_2._8_8_ =
             cmTarget::GetProperty(thisTarget,(string *)&newExplicitLibraries);
      }
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&newExplicitLibraries,"INTERFACE_LINK_LIBRARIES");
    linkIfaceProp.field_2._8_8_ = cmTarget::GetProperty(thisTarget,(string *)&newExplicitLibraries);
  }
  if (((linkIfaceProp.field_2._8_8_ != 0) &&
      (PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar4 == WARN)) &&
     ((this->PolicyWarnedCMP0022 & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"INTERFACE_LINK_LIBRARIES",&local_e1);
    pcVar8 = cmTarget::GetProperty(thisTarget,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    local_c0 = pcVar8;
    if ((pcVar8 != (char *)0x0) &&
       (iVar5 = strcmp(pcVar8,(char *)linkIfaceProp.field_2._8_8_), iVar5 != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_280,(cmPolicies *)0x16,id);
      poVar9 = std::operator<<((ostream *)local_260,(string *)&local_280);
      poVar9 = std::operator<<(poVar9,"\nTarget \"");
      psVar10 = cmTarget::GetName_abi_cxx11_(thisTarget);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9,
                               "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                              );
      poVar9 = std::operator<<(poVar9,(string *)&newExplicitLibraries);
      poVar9 = std::operator<<(poVar9," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
      poVar9 = std::operator<<(poVar9,local_c0);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,(string *)&newExplicitLibraries);
      poVar9 = std::operator<<(poVar9,":\n  ");
      if (linkIfaceProp.field_2._8_8_ == 0) {
        local_608 = "(empty)";
      }
      else {
        local_608 = (char *)linkIfaceProp.field_2._8_8_;
      }
      poVar9 = std::operator<<(poVar9,local_608);
      std::operator<<(poVar9,"\n");
      std::__cxx11::string::~string((string *)&local_280);
      pcVar1 = thisTarget->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      this->PolicyWarnedCMP0022 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    }
  }
  if ((linkIfaceProp.field_2._8_8_ == 0) &&
     ((TVar6 = cmTarget::GetType(thisTarget), TVar6 == EXECUTABLE ||
      (TVar6 = cmTarget::GetType(thisTarget), TVar6 == MODULE_LIBRARY)))) {
    local_2a4 = 1;
  }
  else {
    uVar2 = linkIfaceProp.field_2._8_8_;
    (iface->super_LinkInterface).field_0x6b = 1;
    iface->ExplicitLibraries = (char *)linkIfaceProp.field_2._8_8_;
    if (linkIfaceProp.field_2._8_8_ == 0) {
      PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
      if ((PVar4 == WARN) || (PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar4 == OLD)) {
        local_2d8 = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,headTarget);
        local_2e8._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        __gnu_cxx::
        __normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>::
        __normal_iterator<cmLinkItem*>
                  ((__normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                    *)&local_2e0,&local_2e8);
        __first = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                            (&local_2d8->Libraries);
        __last = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           (&local_2d8->Libraries);
        ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
                      insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                                ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,local_2e0,
                                 (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                  )__first._M_current,
                                 (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                  )__last._M_current);
        PVar4 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
        if ((PVar4 == WARN) &&
           (((this->PolicyWarnedCMP0022 & 1U) == 0 && ((suffix.field_2._M_local_buf[0xf] & 1U) == 0)
            ))) {
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::vector
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_318);
          if ((ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
               ::newProp_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                           ::newProp_abi_cxx11_), iVar5 != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)
                       &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                        ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",
                       (allocator *)((long)&newExplicitLibraries_1 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&newExplicitLibraries_1 + 7))
            ;
            __cxa_atexit(std::__cxx11::string::~string,
                         &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                          ::newProp_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                 ::newProp_abi_cxx11_);
          }
          pcVar8 = cmTarget::GetProperty
                             (thisTarget,
                              &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                               ::newProp_abi_cxx11_);
          pcStack_328 = pcVar8;
          if (pcVar8 != (char *)0x0) {
            local_329 = false;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_350,pcVar8,
                       (allocator *)(oldLibraries.field_2._M_local_buf + 0xf));
            cmTarget::ExpandLinkItems
                      (thisTarget,
                       &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                        ::newProp_abi_cxx11_,&local_350,config,headTarget,
                       (bool)(suffix.field_2._M_local_buf[0xf] & 1),
                       (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_318,&local_329);
            std::__cxx11::string::~string((string *)&local_350);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(oldLibraries.field_2._M_local_buf + 0xf));
          }
          bVar3 = std::operator!=((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_318,
                                  (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
          if (bVar3) {
            cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                      ((string *)((long)&newLibraries.field_2 + 8),&local_2d8->Libraries,";");
            cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                      ((string *)local_398,
                       (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_318,";");
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) != 0) {
              std::__cxx11::string::operator=
                        ((string *)(newLibraries.field_2._M_local_buf + 8),"(empty)");
            }
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) != 0) {
              std::__cxx11::string::operator=((string *)local_398,"(empty)");
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_510);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_530,(cmPolicies *)0x16,id_00);
            poVar9 = std::operator<<((ostream *)local_510,(string *)&local_530);
            poVar9 = std::operator<<(poVar9,"\nTarget \"");
            psVar10 = cmTarget::GetName_abi_cxx11_(thisTarget);
            poVar9 = std::operator<<(poVar9,(string *)psVar10);
            poVar9 = std::operator<<(poVar9,
                                     "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                    );
            poVar9 = std::operator<<(poVar9,(string *)local_398);
            poVar9 = std::operator<<(poVar9,"\nLink implementation:\n  ");
            poVar9 = std::operator<<(poVar9,(string *)(newLibraries.field_2._M_local_buf + 8));
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_530);
            pcVar1 = thisTarget->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_550);
            std::__cxx11::string::~string((string *)&local_550);
            this->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_510);
            std::__cxx11::string::~string((string *)local_398);
            std::__cxx11::string::~string((string *)(newLibraries.field_2._M_local_buf + 8));
          }
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_318);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2c8,(char *)uVar2,(allocator *)((long)&impl + 7));
      cmTarget::ExpandLinkItems
                (thisTarget,(string *)&newExplicitLibraries,&local_2c8,config,headTarget,
                 (bool)(suffix.field_2._M_local_buf[0xf] & 1),
                 (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
                 (bool *)&(iface->super_LinkInterface).field_0x6c);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
    }
    local_2a4 = 0;
  }
  std::__cxx11::string::~string((string *)&newExplicitLibraries);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void
cmTargetInternals::ComputeLinkInterfaceLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkInterface& iface,
  cmTarget const* headTarget,
  bool usage_requirements_only)
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if(!config.empty())
    {
    suffix += cmSystemTools::UpperCase(config);
    }
  else
    {
    suffix += "NOCONFIG";
    }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = 0;
  std::string linkIfaceProp;
  if(thisTarget->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
     thisTarget->GetPolicyStatusCMP0022() != cmPolicies::WARN)
    {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
    }
  else if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY ||
          thisTarget->IsExecutableWithExports())
    {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if(!explicitLibraries)
      {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
      }
    }

  if(explicitLibraries &&
     thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
     !this->PolicyWarnedCMP0022)
    {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      thisTarget->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries
        && strcmp(newExplicitLibraries, explicitLibraries) != 0)
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << thisTarget->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << (explicitLibraries ? explicitLibraries : "(empty)") << "\n";
      thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
      }
    }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if(!explicitLibraries &&
     (thisTarget->GetType() == cmTarget::EXECUTABLE ||
      (thisTarget->GetType() == cmTarget::MODULE_LIBRARY)))
    {
    return;
    }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if(explicitLibraries)
    {
    // The interface libraries have been explicitly set.
    thisTarget->ExpandLinkItems(linkIfaceProp, explicitLibraries, config,
                                headTarget, usage_requirements_only,
                                iface.Libraries,
                                iface.HadHeadSensitiveCondition);
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    // If CMP0022 is NEW then the plain tll signature sets the
    // INTERFACE_LINK_LIBRARIES, so if we get here then the project
    // cleared the property explicitly and we should not fall back
    // to the link implementation.
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const* impl =
      thisTarget->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(),
                           impl->Libraries.begin(), impl->Libraries.end());
    if(thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
       !this->PolicyWarnedCMP0022 && !usage_requirements_only)
      {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if(const char* newExplicitLibraries = thisTarget->GetProperty(newProp))
        {
        bool hadHeadSensitiveConditionDummy = false;
        thisTarget->ExpandLinkItems(newProp, newExplicitLibraries, config,
                                    headTarget, usage_requirements_only,
                                ifaceLibs, hadHeadSensitiveConditionDummy);
        }
      if (ifaceLibs != iface.Libraries)
        {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if(oldLibraries.empty())
          { oldLibraries = "(empty)"; }
        if(newLibraries.empty())
          { newLibraries = "(empty)"; }

        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << thisTarget->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        this->PolicyWarnedCMP0022 = true;
        }
      }
    }
}